

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O3

int mbedtls_entropy_func(void *data,uchar *output,size_t len)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  uchar buf [64];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar8;
  
  iVar5 = -0x3c;
  if (len < 0x41) {
    iVar5 = 0;
    do {
      if (iVar5 == 0x101) {
        return -0x3c;
      }
      iVar3 = entropy_gather_internal((mbedtls_entropy_context *)data);
      if (iVar3 != 0) {
        return iVar3;
      }
      if ((long)*(int *)((long)data + 0xd8) < 1) break;
      iVar5 = iVar5 + 1;
      bVar1 = true;
      lVar4 = 0;
      do {
        if (*(ulong *)((long)data + lVar4 + 0xf0) < *(ulong *)((long)data + lVar4 + 0xf8)) {
          bVar1 = false;
        }
        lVar4 = lVar4 + 0x28;
      } while ((long)*(int *)((long)data + 0xd8) * 0x28 != lVar4);
    } while (!bVar1);
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    mbedtls_sha512_finish((mbedtls_sha512_context *)data,local_78);
    iVar5 = 0;
    memset(data,0,0xd8);
    mbedtls_sha512_starts((mbedtls_sha512_context *)data,0);
    mbedtls_sha512_update((mbedtls_sha512_context *)data,local_78,0x40);
    mbedtls_sha512(local_78,0x40,local_78,0);
    auVar2 = _DAT_00118aa0;
    iVar3 = *(int *)((long)data + 0xd8);
    if (0 < (long)iVar3) {
      lVar4 = (long)iVar3 + -1;
      auVar6._8_4_ = (int)lVar4;
      auVar6._0_8_ = lVar4;
      auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
      lVar4 = 0;
      auVar6 = auVar6 ^ _DAT_00118aa0;
      auVar7 = _DAT_00118a90;
      do {
        auVar9 = auVar7 ^ auVar2;
        if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                    auVar6._4_4_ < auVar9._4_4_) & 1)) {
          *(undefined8 *)((long)data + lVar4 + 0xf0) = 0;
        }
        if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
            auVar9._12_4_ <= auVar6._12_4_) {
          *(undefined8 *)((long)data + lVar4 + 0x118) = 0;
        }
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        lVar4 = lVar4 + 0x50;
      } while ((ulong)(iVar3 + 1U >> 1) * 0x50 != lVar4);
    }
    memcpy(output,local_78,len);
  }
  return iVar5;
}

Assistant:

int mbedtls_entropy_func( void *data, unsigned char *output, size_t len )
{
    int ret, count = 0, i, done;
    mbedtls_entropy_context *ctx = (mbedtls_entropy_context *) data;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( len > MBEDTLS_ENTROPY_BLOCK_SIZE )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

#if defined(MBEDTLS_ENTROPY_NV_SEED)
    /* Update the NV entropy seed before generating any entropy for outside
     * use.
     */
    if( ctx->initial_entropy_run == 0 )
    {
        ctx->initial_entropy_run = 1;
        if( ( ret = mbedtls_entropy_update_nv_seed( ctx ) ) != 0 )
            return( ret );
    }
#endif

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    /*
     * Always gather extra entropy before a call
     */
    do
    {
        if( count++ > ENTROPY_MAX_LOOP )
        {
            ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
            goto exit;
        }

        if( ( ret = entropy_gather_internal( ctx ) ) != 0 )
            goto exit;

        done = 1;
        for( i = 0; i < ctx->source_count; i++ )
            if( ctx->source[i].size < ctx->source[i].threshold )
                done = 0;
    }
    while( ! done );

    memset( buf, 0, MBEDTLS_ENTROPY_BLOCK_SIZE );

#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    mbedtls_sha512_finish( &ctx->accumulator, buf );

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    memset( &ctx->accumulator, 0, sizeof( mbedtls_sha512_context ) );
    mbedtls_sha512_starts( &ctx->accumulator, 0 );
    mbedtls_sha512_update( &ctx->accumulator, buf, MBEDTLS_ENTROPY_BLOCK_SIZE );

    /*
     * Perform second SHA-512 on entropy
     */
    mbedtls_sha512( buf, MBEDTLS_ENTROPY_BLOCK_SIZE, buf, 0 );
#else /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */
    mbedtls_sha256_finish( &ctx->accumulator, buf );

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    memset( &ctx->accumulator, 0, sizeof( mbedtls_sha256_context ) );
    mbedtls_sha256_starts( &ctx->accumulator, 0 );
    mbedtls_sha256_update( &ctx->accumulator, buf, MBEDTLS_ENTROPY_BLOCK_SIZE );

    /*
     * Perform second SHA-256 on entropy
     */
    mbedtls_sha256( buf, MBEDTLS_ENTROPY_BLOCK_SIZE, buf, 0 );
#endif /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */

    for( i = 0; i < ctx->source_count; i++ )
        ctx->source[i].size = 0;

    memcpy( output, buf, len );

    ret = 0;

exit:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}